

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O2

void inithess_lower(double *L,int N,double fi,double fsval,double *dx)

{
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  ulong uVar4;
  double dVar5;
  
  dVar5 = ABS(fi);
  if (ABS(fi) <= fsval) {
    dVar5 = fsval;
  }
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  uVar1 = 0;
  uVar2 = 0;
  pdVar3 = L;
  if (0 < N) {
    uVar2 = (ulong)(uint)N;
  }
  for (; uVar1 != uVar2; uVar1 = uVar1 + 1) {
    L[uVar1 * (long)N + uVar1] = dx[uVar1] * dVar5;
    for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      pdVar3[uVar4] = 0.0;
    }
    pdVar3 = pdVar3 + N;
  }
  return;
}

Assistant:

static void inithess_lower(double *L,int N,double fi,double fsval,double *dx) {
	int i,j,ct;
	double temp;
	
	if (fabs(fi) > fsval) {
		temp = fabs(fi);
	} else {
		temp = fsval;
	}
	
	temp = sqrt(temp);
	
	for(i = 0; i < N;++i) {
		ct = i *N;
		L[ct+i] = temp * dx[i];
		for(j = 0; j < i;++j) {
			L[ct+j] = 0;
		}
	}
	
}